

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t symbol_pseudo(dmr_C *C,entrypoint *ep,symbol *sym)

{
  dmr_C *local_30;
  pseudo_t pseudo;
  symbol *sym_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  if (sym == (symbol *)0x0) {
    C_local = (dmr_C *)&C->L->void_pseudo;
  }
  else {
    local_30 = (dmr_C *)sym->pseudo;
    if (local_30 == (dmr_C *)0x0) {
      local_30 = (dmr_C *)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
      *(int *)&local_30->target = -1;
      *(pseudo_type *)((long)&local_30->target + 4) = PSEUDO_SYM;
      ((anon_union_8_3_da23418f_for_pseudo_5 *)&local_30->L)->sym = sym;
      local_30->P = (parse_state_t *)sym->ident;
      sym->pseudo = (pseudo_t)local_30;
      dmrC_add_pseudo(C,&ep->accesses,(pseudo_t)local_30);
    }
    C_local = local_30;
  }
  return (pseudo_t)C_local;
}

Assistant:

static pseudo_t symbol_pseudo(struct dmr_C *C, struct entrypoint *ep, struct symbol *sym)
{
	pseudo_t pseudo;

	if (!sym)
		return VOID_PSEUDO(C);

	pseudo = sym->pseudo;
	if (!pseudo) {
		pseudo = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
		pseudo->nr = -1;
		pseudo->type = PSEUDO_SYM;
		pseudo->sym = sym;
		pseudo->ident = sym->ident;
		sym->pseudo = pseudo;
		dmrC_add_pseudo(C, &ep->accesses, pseudo);
	}
	/* Symbol pseudos have neither nr, usage nor def */
	return pseudo;
}